

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

void ma_pcm_f32_to_s24(void *dst,void *src,ma_uint64 count,ma_dither_mode ditherMode)

{
  float fVar1;
  ma_uint64 mVar2;
  int iVar3;
  ma_uint8 *dst_s24;
  undefined1 *puVar4;
  float fVar5;
  
  puVar4 = (undefined1 *)((long)dst + 2);
  for (mVar2 = 0; count != mVar2; mVar2 = mVar2 + 1) {
    fVar1 = *(float *)((long)src + mVar2 * 4);
    iVar3 = -0x7fffff;
    if (-1.0 <= fVar1) {
      fVar5 = 1.0;
      if (fVar1 <= 1.0) {
        fVar5 = fVar1;
      }
      iVar3 = (int)(fVar5 * 8388607.0);
    }
    puVar4[-2] = (char)iVar3;
    puVar4[-1] = (char)((uint)iVar3 >> 8);
    *puVar4 = (char)((uint)iVar3 >> 0x10);
    puVar4 = puVar4 + 3;
  }
  return;
}

Assistant:

static MA_INLINE void ma_pcm_f32_to_s24__reference(void* dst, const void* src, ma_uint64 count, ma_dither_mode ditherMode)
{
    ma_uint8* dst_s24 = (ma_uint8*)dst;
    const float* src_f32 = (const float*)src;

    ma_uint64 i;
    for (i = 0; i < count; i += 1) {
        ma_int32 r;
        float x = src_f32[i];
        x = ((x < -1) ? -1 : ((x > 1) ? 1 : x));    /* clip */

#if 0
        /* The accurate way. */
        x = x + 1;                                  /* -1..1 to 0..2 */
        x = x * 8388607.5f;                         /* 0..2 to 0..16777215 */
        x = x - 8388608.0f;                         /* 0..16777215 to -8388608..8388607 */
#else
        /* The fast way. */
        x = x * 8388607.0f;                         /* -1..1 to -8388607..8388607 */
#endif

        r = (ma_int32)x;
        dst_s24[(i*3)+0] = (ma_uint8)((r & 0x0000FF) >>  0);
        dst_s24[(i*3)+1] = (ma_uint8)((r & 0x00FF00) >>  8);
        dst_s24[(i*3)+2] = (ma_uint8)((r & 0xFF0000) >> 16);
    }

    (void)ditherMode;   /* No dithering for f32 -> s24. */
}